

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Operation<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<double,_duckdb::hugeint_t> *state,double *x,hugeint_t *y,
          AggregateBinaryInput *binary)

{
  double dVar1;
  ArgMinMaxBase<duckdb::LessThan,false> AVar2;
  hugeint_t y_data;
  
  if (*this != (ArgMinMaxBase<duckdb::LessThan,false>)0x0) {
    y_data.upper = (int64_t)y;
    y_data.lower = (uint64_t)x[1];
    Execute<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
              (this,(ArgMinMaxState<double,_duckdb::hugeint_t> *)*x,*(double *)state,y_data,binary);
    return;
  }
  if ((*(long *)y[1].lower != 0) &&
     ((*(ulong *)(*(long *)y[1].lower + (y[2].lower >> 6) * 8) >> (y[2].lower & 0x3f) & 1) == 0)) {
    return;
  }
  if (*(long *)y->upper == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    AVar2 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(*(long *)y->upper + ((ulong)y[1].upper >> 6) * 8) >> (y[1].upper & 0x3fU) &
             1) == 0);
    this[1] = AVar2;
    if ((bool)AVar2) goto LAB_00db0322;
  }
  *(undefined8 *)(this + 8) = *(undefined8 *)state;
LAB_00db0322:
  dVar1 = x[1];
  *(double *)(this + 0x10) = *x;
  *(double *)(this + 0x18) = dVar1;
  *this = (ArgMinMaxBase<duckdb::LessThan,false>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}